

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
HecrSequential_cyclicReductionExtendedMatrix_Test::
~HecrSequential_cyclicReductionExtendedMatrix_Test
          (HecrSequential_cyclicReductionExtendedMatrix_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HecrSequential, cyclicReductionExtendedMatrix)
{
    int size = 15;
    const double as_values[] = { 3, 4, 3, 7, 5.5, -6, 4, -1, 3,
        1, 1, 1, 1, 1, 1 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, -1, 2, 1.1, 3.2, 2, 1, -0.3, -2,
        0, 0, 0, 0, 0, 0 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 2, 0.5, -0.7, 1, 0.8, 1, 0.2, 0.5, 0,
        0, 0, 0, 0, 0, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 7, 6.5, 1, 0.9, 8.6, 26, 12.6, 0.3, 1,
        0, 0, 0, 0, 0, 0 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 1, 2, -1, 0, 2, -3, 4, -2, -1,
        0, 0, 0, 0, 0, 0 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}